

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::bind_attrib_location(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLuint local_1c;
  GLuint local_18;
  GLuint shader;
  GLuint maxIndex;
  GLuint program;
  NegativeTestContext *ctx_local;
  
  _maxIndex = ctx;
  shader = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  local_18 = NegativeTestContext::getInteger(_maxIndex,0x8869);
  local_1c = glu::CallLogWrapper::glCreateShader(&_maxIndex->super_CallLogWrapper,0x8b31);
  pNVar1 = _maxIndex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_41);
  NegativeTestContext::beginSection(pNVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glBindAttribLocation(&_maxIndex->super_CallLogWrapper,shader,local_18,"test")
  ;
  NegativeTestContext::expectError(_maxIndex,0x501);
  NegativeTestContext::endSection(_maxIndex);
  pNVar1 = _maxIndex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_OPERATION is generated if name starts with the reserved prefix \"gl_\".",
             &local_79);
  NegativeTestContext::beginSection(pNVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glBindAttribLocation
            (&_maxIndex->super_CallLogWrapper,shader,local_18 - 1,"gl_test");
  NegativeTestContext::expectError(_maxIndex,0x502);
  NegativeTestContext::endSection(_maxIndex);
  pNVar1 = _maxIndex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             &local_a1);
  NegativeTestContext::beginSection(pNVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  glu::CallLogWrapper::glBindAttribLocation
            (&_maxIndex->super_CallLogWrapper,0xffffffff,local_18 - 1,"test");
  NegativeTestContext::expectError(_maxIndex,0x501);
  NegativeTestContext::endSection(_maxIndex);
  pNVar1 = _maxIndex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_c9);
  NegativeTestContext::beginSection(pNVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  glu::CallLogWrapper::glBindAttribLocation
            (&_maxIndex->super_CallLogWrapper,local_1c,local_18 - 1,"test");
  NegativeTestContext::expectError(_maxIndex,0x502);
  NegativeTestContext::endSection(_maxIndex);
  glu::CallLogWrapper::glDeleteProgram(&_maxIndex->super_CallLogWrapper,shader);
  glu::CallLogWrapper::glDeleteShader(&_maxIndex->super_CallLogWrapper,local_1c);
  return;
}

Assistant:

void bind_attrib_location (NegativeTestContext& ctx)
{
	GLuint program = ctx.glCreateProgram();
	GLuint maxIndex = ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	GLuint shader = ctx.glCreateShader(GL_VERTEX_SHADER);

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	ctx.glBindAttribLocation(program, maxIndex, "test");
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if name starts with the reserved prefix \"gl_\".");
	ctx.glBindAttribLocation(program, maxIndex-1, "gl_test");
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glBindAttribLocation(-1, maxIndex-1, "test");
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glBindAttribLocation(shader, maxIndex-1, "test");
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteProgram(program);
	ctx.glDeleteShader(shader);
}